

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::write_decimal<int>
          (basic_writer<fmt::v5::output_range<char_*,_char>_> *this,int value)

{
  type_conflict4 tVar1;
  char **out;
  char *pcVar2;
  uint32_t in_ESI;
  size_t in_RDI;
  char **it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  basic_writer<fmt::v5::output_range<char_*,_char>_> *in_stack_ffffffffffffffe0;
  uint32_t local_10;
  
  tVar1 = internal::is_negative<int>(in_ESI);
  local_10 = in_ESI;
  if (tVar1) {
    local_10 = -in_ESI;
  }
  internal::count_digits(local_10);
  out = reserve(in_stack_ffffffffffffffe0,in_RDI);
  if (tVar1) {
    pcVar2 = *out;
    *out = pcVar2 + 1;
    *pcVar2 = '-';
  }
  pcVar2 = internal::format_decimal<char,char*,unsigned_int>
                     ((char *)out,(uint)(in_RDI >> 0x20),(int)in_RDI);
  *out = pcVar2;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }